

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall Server::BuryTheDead(Server *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  time_t tVar3;
  const_iterator __position;
  list<Client_*,_std::allocator<Client_*>_> *this_00;
  
  this_00 = &this->clients;
  __position._M_node = (_List_node_base *)this_00;
  do {
    do {
      __position._M_node = (__position._M_node)->_M_next;
      if (__position._M_node == (_List_node_base *)this_00) {
        return;
      }
      p_Var1 = __position._M_node[1]._M_next;
    } while ((*(char *)&p_Var1[1]._M_prev != '\0') ||
            (((p_Var1[7]._M_next != (_List_node_base *)0x0 ||
              (p_Var1[3]._M_prev != (_List_node_base *)0x0)) &&
             (p_Var2 = p_Var1[2]._M_next, tVar3 = time((time_t *)0x0),
             tVar3 <= (long)((long)&p_Var2->_M_next + 2)))));
    close(*(int *)&p_Var1->_M_prev->_M_next);
    (*(code *)p_Var1->_M_next[1]._M_next)(p_Var1);
    __position._M_node =
         (_List_node_base *)
         std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::erase(this_00,__position);
  } while (__position._M_node != (_List_node_base *)this_00);
  return;
}

Assistant:

void Server::BuryTheDead()
{
	UTIL_IFOREACH(this->clients, it)
	{
		Client *client = *it;

		if (!client->Connected() && ((client->send_buffer.length() == 0 && client->recv_buffer.length() == 0) || client->closed_time + 2 < std::time(0)))
		{
#ifdef WIN32
			closesocket(client->impl->sock);
#else // WIN32
			close(client->impl->sock);
#endif // WIN32
			delete client;
			it = this->clients.erase(it);
			if (it == this->clients.end())
				break;
		}
	}
}